

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::fuse_deconvolutiondepthwise_batchnorm(NetOptimize *this)

{
  float fVar1;
  int iVar2;
  Layer *pLVar3;
  int *piVar4;
  pointer ppLVar5;
  Layer *pLVar6;
  long lVar7;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  pointer pcVar11;
  ulong uVar12;
  int j;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  float fVar18;
  ulong local_c0;
  vector<float,_std::allocator<float>_> b;
  vector<float,_std::allocator<float>_> a;
  Mat local_70;
  
  uVar15 = (ulong)((long)(this->super_Net).layers.
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->super_Net).layers.
                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 3;
  iVar14 = (int)uVar15;
  uVar10 = 0;
  if (0 < iVar14) {
    uVar10 = uVar15 & 0xffffffff;
  }
  local_c0 = 1;
  uVar15 = 0;
  do {
    if (uVar15 == uVar10) {
      return 0;
    }
    bVar8 = std::operator!=(&(this->super_Net).layers.
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar15]->type,
                            "DeconvolutionDepthWise");
    if (!bVar8) {
      iVar2 = *((this->super_Net).layers.
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar15]->tops).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      for (uVar16 = local_c0; (int)uVar16 < iVar14; uVar16 = uVar16 + 1) {
        bVar8 = std::operator!=(&(this->super_Net).layers.
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar16]->type,"BatchNorm")
        ;
        if (((!bVar8) &&
            (pLVar3 = (this->super_Net).layers.
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar16],
            piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            (long)*(pointer *)
                   ((long)&(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl +
                   8) - (long)piVar4 == 4)) && (*piVar4 == iVar2)) {
          if ((int)uVar16 != iVar14) {
            ppLVar5 = (this->super_Net).layers.
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar3 = ppLVar5[uVar15];
            pLVar6 = ppLVar5[uVar16 & 0xffffffff];
            fprintf(_stderr,"fuse_deconvolutiondepthwise_batchnorm %s %s\n",
                    (pLVar3->name)._M_dataplus._M_p);
            uVar9 = *(uint *)&pLVar6[1]._vptr_Layer;
            fVar1 = *(float *)((long)&pLVar6[1]._vptr_Layer + 4);
            std::vector<float,_std::allocator<float>_>::vector
                      (&a,(long)(int)uVar9,(allocator_type *)&local_70);
            std::vector<float,_std::allocator<float>_>::vector
                      (&b,(long)(int)uVar9,(allocator_type *)&local_70);
            uVar16 = 0;
            if (0 < (int)uVar9) {
              uVar16 = (ulong)uVar9;
            }
            for (uVar17 = 0; uVar16 != uVar17; uVar17 = uVar17 + 1) {
              fVar18 = *(float *)(*(long *)&pLVar6[2].one_blob_only + uVar17 * 4) + fVar1;
              if (fVar18 < 0.0) {
                fVar18 = sqrtf(fVar18);
              }
              else {
                fVar18 = SQRT(fVar18);
              }
              lVar7 = *(long *)&pLVar6[1].one_blob_only;
              a.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar17] =
                   *(float *)(*(long *)((long)&pLVar6[2].name.field_2 + 8) + uVar17 * 4) -
                   (*(float *)(lVar7 + uVar17 * 4) *
                   *(float *)(*(long *)((long)&pLVar6[1].name.field_2 + 8) + uVar17 * 4)) / fVar18;
              b.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar17] = *(float *)(lVar7 + uVar17 * 4) / fVar18;
            }
            if (*(int *)((long)&pLVar3[1].name._M_string_length + 4) == 0) {
              *(undefined4 *)((long)&pLVar3[1].name._M_string_length + 4) = 1;
              ncnn::Mat::Mat(&local_70,uVar9,4,(Allocator *)0x0);
              ncnn::Mat::operator=((Mat *)&pLVar3[2].bottoms,&local_70);
              ncnn::Mat::~Mat(&local_70);
              ncnn::Mat::fill((Mat *)&pLVar3[2].bottoms,0.0);
            }
            uVar9 = *(int *)&pLVar3[1].name.field_2 / (int)uVar9;
            pcVar11 = pLVar3[2].type._M_dataplus._M_p;
            lVar7 = *(long *)&pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data;
            uVar17 = 0;
            if (0 < (int)uVar9) {
              uVar17 = (ulong)uVar9;
            }
            for (uVar12 = 0; uVar12 != uVar16; uVar12 = uVar12 + 1) {
              for (uVar13 = 0; uVar17 != uVar13; uVar13 = uVar13 + 1) {
                *(float *)(pcVar11 + uVar13 * 4) =
                     b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar12] * *(float *)(pcVar11 + uVar13 * 4);
              }
              *(float *)(lVar7 + uVar12 * 4) =
                   *(float *)(lVar7 + uVar12 * 4) *
                   b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar12] +
                   a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar12];
              pcVar11 = pcVar11 + (long)(int)uVar9 * 4;
            }
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&b.super__Vector_base<float,_std::allocator<float>_>);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&a.super__Vector_base<float,_std::allocator<float>_>);
            iVar2 = *(pLVar6->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar2;
            (this->super_Net).blobs.super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar2].producer = (int)uVar15;
            std::__cxx11::string::assign((char *)&pLVar6->type);
          }
          break;
        }
      }
    }
    uVar15 = uVar15 + 1;
    local_c0 = local_c0 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_deconvolutiondepthwise_batchnorm()
{
    const int layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "DeconvolutionDepthWise")
            continue;

        // DeconvolutionDepthWise - BatchNorm
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "BatchNorm")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse DeconvolutionDepthWise - BatchNorm to DeconvolutionDepthWise
        ncnn::DeconvolutionDepthWise* deconvolutiondepthwise = (ncnn::DeconvolutionDepthWise*)layers[i];
        ncnn::BatchNorm* batchnorm = (ncnn::BatchNorm*)layers[j];

        fprintf(stderr, "fuse_deconvolutiondepthwise_batchnorm %s %s\n", deconvolutiondepthwise->name.c_str(), batchnorm->name.c_str());

        {
            int channels = batchnorm->channels;
            float eps = batchnorm->eps;

            // a = bias - slope * mean / sqrt(var + eps)
            // b = slope / sqrt(var + eps)
            // value = value * b + a

            std::vector<float> a(channels);
            std::vector<float> b(channels);
            for (int i=0; i<channels; i++)
            {
                float sqrt_var = sqrt(batchnorm->var_data[i] + eps);
                a[i] = batchnorm->bias_data[i] - batchnorm->slope_data[i] * batchnorm->mean_data[i] / sqrt_var;
                b[i] = batchnorm->slope_data[i] / sqrt_var;
            }

            if (deconvolutiondepthwise->bias_term == 0)
            {
                // init bias as zero
                deconvolutiondepthwise->bias_term = 1;
                deconvolutiondepthwise->bias_data = ncnn::Mat(channels);
                deconvolutiondepthwise->bias_data.fill(0.f);
            }

            const int weight_per_outch = deconvolutiondepthwise->weight_data_size / channels;

            float* weight = deconvolutiondepthwise->weight_data;
            float* bias = deconvolutiondepthwise->bias_data;
            for (int i=0; i<channels; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j=0; j<weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= b[i];
                }

                bias[i] = bias[i] * b[i] + a[i];
            }
        }

        int top_blob_index_final = batchnorm->tops[0];
        deconvolutiondepthwise->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        batchnorm->type = "ncnnfused";
    }

    return 0;
}